

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdDot<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  Value VVar1;
  Value VVar2;
  
  VVar1 = Pop(this);
  VVar2 = Pop(this);
  VVar1.field_0 =
       (anon_union_16_6_113bff37_for_Value_0)
       pmaddwd((undefined1  [16])VVar2.field_0,(undefined1  [16])VVar1.field_0);
  Push(this,VVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDot() {
  using SL = typename S::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx] * rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1] * rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
  }
  Push(result);
  return RunResult::Ok;
}